

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleInterpolationTests.cpp
# Opt level: O0

VertexDataDesc * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues>::
getVertexDataDescripton
          (VertexDataDesc *__return_storage_ptr__,
          MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this)

{
  undefined1 auStack_38 [8];
  VkVertexInputAttributeDescription vertexAttribPositionNdc;
  MSInstance<vkt::pipeline::multisample::MSInstanceDistinctValues> *this_local;
  VertexDataDesc *vertexDataDesc;
  
  MultisampleInstanceBase::VertexDataDesc::VertexDataDesc(__return_storage_ptr__);
  __return_storage_ptr__->verticesCount = 3;
  __return_storage_ptr__->dataStride = 0x10;
  __return_storage_ptr__->dataSize =
       (ulong)(__return_storage_ptr__->verticesCount * __return_storage_ptr__->dataStride);
  __return_storage_ptr__->primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  auStack_38._0_4_ = 0;
  auStack_38._4_4_ = 0;
  vertexAttribPositionNdc.location = 0x6d;
  vertexAttribPositionNdc.binding = 0;
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::push_back(&__return_storage_ptr__->vertexAttribDescVec,(value_type *)auStack_38);
  return __return_storage_ptr__;
}

Assistant:

MultisampleInstanceBase::VertexDataDesc MSInstance<MSInstanceDistinctValues>::getVertexDataDescripton (void) const
{
	VertexDataDesc vertexDataDesc;

	vertexDataDesc.verticesCount		= 3u;
	vertexDataDesc.dataStride			= sizeof(VertexDataNdc);
	vertexDataDesc.dataSize				= vertexDataDesc.verticesCount * vertexDataDesc.dataStride;
	vertexDataDesc.primitiveTopology	= VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;

	const VkVertexInputAttributeDescription vertexAttribPositionNdc =
	{
		0u,										// deUint32	location;
		0u,										// deUint32	binding;
		VK_FORMAT_R32G32B32A32_SFLOAT,			// VkFormat	format;
		DE_OFFSET_OF(VertexDataNdc, positionNdc),	// deUint32	offset;
	};

	vertexDataDesc.vertexAttribDescVec.push_back(vertexAttribPositionNdc);

	return vertexDataDesc;
}